

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

char * bc_str_find(char *str,char c)

{
  char cVar1;
  size_t i;
  long lVar2;
  size_t sVar3;
  
  if (str == (char *)0x0) {
    return (char *)0x0;
  }
  if (c == '\0') {
    sVar3 = strlen(str);
    return str + sVar3;
  }
  lVar2 = 0;
  do {
    cVar1 = str[lVar2];
    if (cVar1 == '\\') {
      lVar2 = lVar2 + 1;
    }
    else {
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      if (cVar1 == c) {
        return str + lVar2;
      }
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

char*
bc_str_find(const char *str, char c)
{
    // this is somewhat similar to strchr, but respects '\' escaping.
    if (str == NULL)
        return NULL;
    if (c == '\0')
        return (char*) str + strlen(str);
    for (size_t i = 0; str[i] != '\0'; i++) {
        if (str[i] == '\\') {
            i++;
            continue;
        }
        if (str[i] == c) {
            return (char*) str + i;
        }
    }
    return NULL;
}